

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O2

int link_set_max_link_credit(LINK_HANDLE link,uint32_t max_link_credit)

{
  if (link != (LINK_HANDLE)0x0) {
    link->max_link_credit = max_link_credit;
    return 0;
  }
  return 0x483;
}

Assistant:

int link_set_max_link_credit(LINK_HANDLE link, uint32_t max_link_credit)
{
    int result;

    if (link == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        link->max_link_credit = max_link_credit;
        result = 0;
    }

    return result;
}